

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_helpers.cc
# Opt level: O1

string * __thiscall
google::protobuf::compiler::javanano::ClassName_abi_cxx11_
          (string *__return_storage_ptr__,javanano *this,Params *params,FileDescriptor *descriptor)

{
  string local_38;
  
  FileJavaPackage_abi_cxx11_(__return_storage_ptr__,this,params,descriptor);
  if (__return_storage_ptr__->_M_string_length != 0) {
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
  }
  FileClassName_abi_cxx11_(&local_38,this,params,descriptor);
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_38._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

string ClassName(const Params& params, const FileDescriptor* descriptor) {
  string result = FileJavaPackage(params, descriptor);
  if (!result.empty()) result += '.';
  result += FileClassName(params, descriptor);
  return result;
}